

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O1

void __thiscall
duckdb::BatchedBufferedData::UpdateMinBatchIndex(BatchedBufferedData *this,idx_t min_batch_index)

{
  mutex *__mutex;
  int iVar1;
  lock_guard<std::mutex> *lock;
  
  __mutex = &(this->super_BufferedData).glock;
  lock = (lock_guard<std::mutex> *)min_batch_index;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if (this->min_batch < min_batch_index) {
      this->min_batch = min_batch_index;
      MoveCompletedBatches(this,lock);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void BatchedBufferedData::UpdateMinBatchIndex(idx_t min_batch_index) {
	lock_guard<mutex> lock(glock);

	auto old_min_batch = min_batch;
	auto new_min_batch = MaxValue(old_min_batch, min_batch_index);
	if (new_min_batch == min_batch) {
		// No change, early out
		return;
	}
	min_batch = new_min_batch;
	MoveCompletedBatches(lock);
}